

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O1

void __thiscall
ktx::CommandCreate::processOptions(CommandCreate *this,Options *opts,ParseResult *args)

{
  Reporter *report;
  BasisCodec BVar1;
  VkFormat VVar2;
  size_t sVar3;
  CommandCreate *pCVar4;
  bool bVar5;
  _Storage<unsigned_int,_true> _Var6;
  OptionValue *pOVar7;
  undefined8 uVar8;
  _Storage<unsigned_int,_true> _Var9;
  VkFormat extraout_EDX;
  VkFormat extraout_EDX_00;
  VkFormat extraout_EDX_01;
  VkFormat extraout_EDX_02;
  VkFormat extraout_EDX_03;
  VkFormat extraout_EDX_04;
  VkFormat extraout_EDX_05;
  VkFormat VVar10;
  VkFormat format;
  VkFormat extraout_EDX_06;
  VkFormat extraout_EDX_07;
  long lVar11;
  uint uVar12;
  ktx *this_00;
  char *astcOption;
  allocator<char> local_69;
  string local_68;
  Combine<ktx::OptionsCreate,_ktx::OptionsEncodeASTC,_ktx::OptionsEncodeBasis<false>,_ktx::OptionsEncodeCommon,_ktx::OptionsMetrics,_ktx::OptionsDeflate,_ktx::OptionsMultiInSingleOut,_ktx::OptionsGeneric>
  *local_48;
  CommandCreate *local_40;
  char *local_38;
  
  local_48 = &this->options;
  report = &(this->super_Command).super_Reporter;
  Combine<ktx::OptionsCreate,_ktx::OptionsEncodeASTC,_ktx::OptionsEncodeBasis<false>,_ktx::OptionsEncodeCommon,_ktx::OptionsMetrics,_ktx::OptionsDeflate,_ktx::OptionsMultiInSingleOut,_ktx::OptionsGeneric>
  ::process(local_48,opts,args,report);
  _Var6._M_value = 1;
  _Var9._M_value = 1;
  if ((this->options).super_OptionsCreate.levels.super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged != false) {
    _Var9 = (this->options).super_OptionsCreate.levels.
            super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload;
  }
  this->numLevels = (uint32_t)_Var9;
  _Var9._M_value = 1;
  if ((this->options).super_OptionsCreate.layers.super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged != false) {
    _Var9 = (this->options).super_OptionsCreate.layers.
            super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload;
  }
  this->numLayers = (uint32_t)_Var9;
  bVar5 = (this->options).super_OptionsCreate.cubemap;
  this->numFaces = (uint)bVar5 + (uint)bVar5 * 4 + 1;
  if ((this->options).super_OptionsCreate.depth.super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged != false) {
    _Var6 = (this->options).super_OptionsCreate.depth.super__Optional_base<unsigned_int,_true,_true>
            ._M_payload.super__Optional_payload_base<unsigned_int>._M_payload;
  }
  this->baseDepth = (uint32_t)_Var6;
  if ((this->options).super_OptionsCreate.raw == true) {
    checkNumInputImages(this);
  }
  bVar5 = isFormatAstc((this->options).super_OptionsCreate.vkFormat);
  local_40 = this;
  if (bVar5) {
    (this->options).super_OptionsEncodeASTC.super_ktxAstcParams.threadCount =
         (this->options).super_OptionsEncodeCommon.threadCount;
    (this->options).super_OptionsEncodeASTC.super_ktxAstcParams.normalMap =
         (this->options).super_OptionsEncodeCommon.normalMap;
    VVar10 = extraout_EDX;
    if ((this->options).super_OptionsEncodeCommon.noSSE == true) {
      Reporter::fatal_usage<char_const(&)[37],char_const*&>
                (report,(char (*) [37])"--{} is not allowed with ASTC encode",
                 &OptionsEncodeCommon::kNoSse);
      VVar10 = extraout_EDX_00;
    }
  }
  else {
    lVar11 = 0;
    do {
      local_38 = *(char **)((long)OptionsEncodeASTC::kAstcOptions + lVar11);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,local_38,&local_69);
      pOVar7 = cxxopts::ParseResult::operator[](args,&local_68);
      sVar3 = pOVar7->m_count;
      VVar10 = extraout_EDX_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        VVar10 = extraout_EDX_02;
      }
      if (sVar3 != 0) {
        Reporter::fatal_usage<char_const(&)[41],char_const*&>
                  (report,(char (*) [41])"--{} can only be used with ASTC formats.",&local_38);
        VVar10 = extraout_EDX_03;
      }
      lVar11 = lVar11 + 8;
    } while (lVar11 != 0x10);
  }
  pCVar4 = local_40;
  if ((local_40->options).super_OptionsEncodeBasis<false>.codec == BasisLZ) {
    if ((local_40->options).super_OptionsDeflate.zstd.super__Optional_base<unsigned_int,_true,_true>
        ._M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      Reporter::fatal_usage<char_const(&)[54]>
                (report,(char (*) [54])"Cannot encode to BasisLZ and supercompress with Zstd.");
      VVar10 = extraout_EDX_04;
    }
    if ((pCVar4->options).super_OptionsDeflate.zlib.super__Optional_base<unsigned_int,_true,_true>.
        _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      Reporter::fatal_usage<char_const(&)[54]>
                (report,(char (*) [54])"Cannot encode to BasisLZ and supercompress with ZLIB.");
      VVar10 = extraout_EDX_05;
    }
  }
  if (((pCVar4->options).super_OptionsEncodeBasis<false>.codec != NONE) &&
     ((this_00 = (ktx *)(ulong)(pCVar4->options).super_OptionsCreate.vkFormat, (ktx *)0x2b < this_00
      || ((0x82020c18200U >> ((ulong)this_00 & 0x3f) & 1) == 0)))) {
    toString_abi_cxx11_(&local_68,this_00,VVar10);
    Reporter::fatal_usage<char_const(&)[86],std::__cxx11::string>
              (report,(char (*) [86])
                      "Only R8, RG8, RGB8, or RGBA8 UNORM and SRGB formats can be encoded, but format is {}."
               ,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  BVar1 = (pCVar4->options).super_OptionsEncodeBasis<false>.codec;
  bVar5 = isFormatAstc((pCVar4->options).super_OptionsCreate.vkFormat);
  uVar12 = BVar1 - BasisLZ;
  if (uVar12 < 2) {
    (pCVar4->options).super_OptionsEncodeBasis<false>.super_ktxBasisParams.threadCount =
         (pCVar4->options).super_OptionsEncodeCommon.threadCount;
    (pCVar4->options).super_OptionsEncodeBasis<false>.super_ktxBasisParams.normalMap =
         (pCVar4->options).super_OptionsEncodeCommon.normalMap;
    (pCVar4->options).super_OptionsEncodeBasis<false>.super_ktxBasisParams.noSSE =
         (pCVar4->options).super_OptionsEncodeCommon.noSSE;
  }
  else if ((pCVar4->options).super_OptionsEncodeCommon.field_0x29 == '\x01' && !bVar5) {
    Reporter::fatal_usage<char_const(&)[70]>
              (report,(char (*) [70])
                      "--compare-ssim can only be used with BasisLZ, UASTC or ASTC encoding.");
  }
  if ((1 < uVar12) && (!bVar5 && (pCVar4->options).super_OptionsEncodeCommon.field_0x2a == '\x01'))
  {
    Reporter::fatal_usage<char_const(&)[70]>
              (report,(char (*) [70])
                      "--compare-psnr can only be used with BasisLZ, UASTC or ASTC encoding.");
  }
  bVar5 = isFormatAstc((pCVar4->options).super_OptionsCreate.vkFormat);
  VVar10 = format;
  if ((bVar5) && ((pCVar4->options).super_OptionsCreate.raw == false)) {
    (pCVar4->options).super_OptionsEncodeASTC.encodeASTC = true;
    VVar2 = (pCVar4->options).super_OptionsCreate.vkFormat;
    switch(VVar2) {
    case VK_FORMAT_ASTC_4x4_UNORM_BLOCK:
    case VK_FORMAT_ASTC_4x4_SRGB_BLOCK:
      uVar8 = 0x100000000;
      break;
    case VK_FORMAT_ASTC_5x4_UNORM_BLOCK:
    case VK_FORMAT_ASTC_5x4_SRGB_BLOCK:
      uVar8 = 0x100000001;
      break;
    case VK_FORMAT_ASTC_5x5_UNORM_BLOCK:
    case VK_FORMAT_ASTC_5x5_SRGB_BLOCK:
      uVar8 = 0x100000002;
      break;
    case VK_FORMAT_ASTC_6x5_UNORM_BLOCK:
    case VK_FORMAT_ASTC_6x5_SRGB_BLOCK:
      uVar8 = 0x100000003;
      break;
    case VK_FORMAT_ASTC_6x6_UNORM_BLOCK:
    case VK_FORMAT_ASTC_6x6_SRGB_BLOCK:
      uVar8 = 0x100000004;
      break;
    case VK_FORMAT_ASTC_8x5_UNORM_BLOCK:
    case VK_FORMAT_ASTC_8x5_SRGB_BLOCK:
      uVar8 = 0x100000005;
      break;
    case VK_FORMAT_ASTC_8x6_UNORM_BLOCK:
    case VK_FORMAT_ASTC_8x6_SRGB_BLOCK:
      uVar8 = 0x100000006;
      break;
    case VK_FORMAT_ASTC_8x8_UNORM_BLOCK:
    case VK_FORMAT_ASTC_8x8_SRGB_BLOCK:
      uVar8 = 0x100000009;
      break;
    case VK_FORMAT_ASTC_10x5_UNORM_BLOCK:
    case VK_FORMAT_ASTC_10x5_SRGB_BLOCK:
      uVar8 = 0x100000007;
      break;
    case VK_FORMAT_ASTC_10x6_UNORM_BLOCK:
    case VK_FORMAT_ASTC_10x6_SRGB_BLOCK:
      uVar8 = 0x100000008;
      break;
    case VK_FORMAT_ASTC_10x8_UNORM_BLOCK:
    case VK_FORMAT_ASTC_10x8_SRGB_BLOCK:
      uVar8 = 0x10000000a;
      break;
    case VK_FORMAT_ASTC_10x10_UNORM_BLOCK:
    case VK_FORMAT_ASTC_10x10_SRGB_BLOCK:
      uVar8 = 0x10000000b;
      break;
    case VK_FORMAT_ASTC_12x10_UNORM_BLOCK:
    case VK_FORMAT_ASTC_12x10_SRGB_BLOCK:
      uVar8 = 0x10000000c;
      break;
    case VK_FORMAT_ASTC_12x12_UNORM_BLOCK:
    case VK_FORMAT_ASTC_12x12_SRGB_BLOCK:
      uVar8 = 0x10000000d;
      break;
    default:
      toString_abi_cxx11_(&local_68,(ktx *)(ulong)VVar2,format);
      Reporter::fatal<char_const(&)[37],std::__cxx11::string>
                (report,NOT_SUPPORTED,(char (*) [37])"{} is unsupported for ASTC encoding.",
                 &local_68);
      VVar10 = extraout_EDX_06;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        VVar10 = extraout_EDX_07;
      }
      goto LAB_00155b25;
    }
    (pCVar4->options).super_OptionsEncodeASTC.super_ktxAstcParams.blockDimension = (int)uVar8;
    (pCVar4->options).super_OptionsEncodeASTC.super_ktxAstcParams.mode = (int)((ulong)uVar8 >> 0x20)
    ;
  }
LAB_00155b25:
  if (((local_48->super_OptionsCreate)._1d == true) &&
     ((pCVar4->options).super_OptionsEncodeASTC.encodeASTC == true)) {
    toString_abi_cxx11_(&local_68,(ktx *)(ulong)(pCVar4->options).super_OptionsCreate.vkFormat,
                        VVar10);
    Reporter::fatal_usage<char_const(&)[78],std::__cxx11::string>
              (report,(char (*) [78])
                      "ASTC format {} cannot be used for 1 dimensional textures (indicated by --1d)."
               ,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void CommandCreate::processOptions(cxxopts::Options& opts, cxxopts::ParseResult& args) {
    options.process(opts, args, *this);

    numLevels = options.levels.value_or(1);
    numLayers = options.layers.value_or(1);
    numFaces = options.cubemap ? 6 : 1;
    baseDepth = options.depth.value_or(1u);

    if (options.raw) {
        // options.levels <= max for dimensions was checked in CreateOptions::process
        checkNumInputImages();
    }

    if (!isFormatAstc(options.vkFormat)) {
        for (const char* astcOption : OptionsEncodeASTC::kAstcOptions)
            if (args[astcOption].count())
                fatal_usage("--{} can only be used with ASTC formats.", astcOption);
    } else {
        fillOptionsCodecAstc<decltype(options)>(options);
        if (options.OptionsEncodeCommon::noSSE)
            fatal_usage("--{} is not allowed with ASTC encode", OptionsEncodeCommon::kNoSse);
    }

    if (options.codec == BasisCodec::BasisLZ) {
        if (options.zstd.has_value())
            fatal_usage("Cannot encode to BasisLZ and supercompress with Zstd.");

        if (options.zlib.has_value())
            fatal_usage("Cannot encode to BasisLZ and supercompress with ZLIB.");
    }

    if (options.codec != BasisCodec::NONE) {
        switch (options.vkFormat) {
        case VK_FORMAT_R8_UNORM:
        case VK_FORMAT_R8_SRGB:
        case VK_FORMAT_R8G8_UNORM:
        case VK_FORMAT_R8G8_SRGB:
        case VK_FORMAT_R8G8B8_UNORM:
        case VK_FORMAT_R8G8B8_SRGB:
        case VK_FORMAT_R8G8B8A8_UNORM:
        case VK_FORMAT_R8G8B8A8_SRGB:
            // Allowed formats
            break;
        default:
            fatal_usage("Only R8, RG8, RGB8, or RGBA8 UNORM and SRGB formats can be encoded, "
                "but format is {}.", toString(VkFormat(options.vkFormat)));
            break;
        }
    }

    const auto basisCodec = options.codec == BasisCodec::BasisLZ || options.codec == BasisCodec::UASTC;
    const auto astcCodec = isFormatAstc(options.vkFormat);
    const auto canCompare = basisCodec || astcCodec;

    if (basisCodec)
        fillOptionsCodecBasis<decltype(options)>(options);

    if (options.compare_ssim && !canCompare)
        fatal_usage("--compare-ssim can only be used with BasisLZ, UASTC or ASTC encoding.");
    if (options.compare_psnr && !canCompare)
        fatal_usage("--compare-psnr can only be used with BasisLZ, UASTC or ASTC encoding.");

    if (isFormatAstc(options.vkFormat) && !options.raw) {
        options.encodeASTC = true;

        switch (options.vkFormat) {
        case VK_FORMAT_ASTC_4x4_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_4x4_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_4x4;
            break;
        case VK_FORMAT_ASTC_5x4_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_5x4_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_5x4;
            break;
        case VK_FORMAT_ASTC_5x5_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_5x5_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_5x5;
            break;
        case VK_FORMAT_ASTC_6x5_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_6x5_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_6x5;
            break;
        case VK_FORMAT_ASTC_6x6_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_6x6_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_6x6;
            break;
        case VK_FORMAT_ASTC_8x5_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_8x5_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_8x5;
            break;
        case VK_FORMAT_ASTC_8x6_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_8x6_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_8x6;
            break;
        case VK_FORMAT_ASTC_8x8_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_8x8_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_8x8;
            break;
        case VK_FORMAT_ASTC_10x5_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_10x5_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_10x5;
            break;
        case VK_FORMAT_ASTC_10x6_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_10x6_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_10x6;
            break;
        case VK_FORMAT_ASTC_10x8_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_10x8_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_10x8;
            break;
        case VK_FORMAT_ASTC_10x10_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_10x10_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_10x10;
            break;
        case VK_FORMAT_ASTC_12x10_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_12x10_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_12x10;
            break;
        case VK_FORMAT_ASTC_12x12_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_12x12_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_12x12;
            break;
        default:
            fatal(rc::NOT_SUPPORTED, "{} is unsupported for ASTC encoding.", toString(options.vkFormat));
            break;
        }
    }

    if (options._1d && options.encodeASTC)
        fatal_usage("ASTC format {} cannot be used for 1 dimensional textures (indicated by --1d).",
                toString(options.vkFormat));

}